

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem-disk-unix.c++
# Opt level: O0

Type kj::anon_unknown_9::modeToType(mode_t mode)

{
  uint uVar1;
  undefined4 local_c;
  mode_t mode_local;
  
  uVar1 = mode & 0xf000;
  if (uVar1 == 0x1000) {
    local_c = NAMED_PIPE;
  }
  else if (uVar1 == 0x2000) {
    local_c = CHARACTER_DEVICE;
  }
  else if (uVar1 == 0x4000) {
    local_c = DIRECTORY;
  }
  else if (uVar1 == 0x6000) {
    local_c = BLOCK_DEVICE;
  }
  else if (uVar1 == 0x8000) {
    local_c = FILE;
  }
  else if (uVar1 == 0xa000) {
    local_c = SYMLINK;
  }
  else if (uVar1 == 0xc000) {
    local_c = SOCKET;
  }
  else {
    local_c = OTHER;
  }
  return local_c;
}

Assistant:

static FsNode::Type modeToType(mode_t mode) {
  switch (mode & S_IFMT) {
    case S_IFREG : return FsNode::Type::FILE;
    case S_IFDIR : return FsNode::Type::DIRECTORY;
    case S_IFLNK : return FsNode::Type::SYMLINK;
    case S_IFBLK : return FsNode::Type::BLOCK_DEVICE;
    case S_IFCHR : return FsNode::Type::CHARACTER_DEVICE;
    case S_IFIFO : return FsNode::Type::NAMED_PIPE;
    case S_IFSOCK: return FsNode::Type::SOCKET;
    default: return FsNode::Type::OTHER;
  }
}